

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# format.cc
# Opt level: O2

void __thiscall
fmt::internal::PrintfArgFormatter<char>::visit_char(PrintfArgFormatter<char> *this,int value)

{
  BasicWriter<char> *this_00;
  FormatSpec *pFVar1;
  uint uVar2;
  CharPtr __s;
  size_t __len;
  ulong n;
  
  this_00 = (this->super_ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char>).writer_;
  pFVar1 = (this->super_ArgFormatterBase<fmt::internal::PrintfArgFormatter<char>,_char>).spec_;
  if ((pFVar1->type_ != '\0') && (pFVar1->type_ != 'c')) {
    BasicWriter<char>::write_int<int,fmt::FormatSpec>(this_00,value,*pFVar1);
  }
  n = (ulong)(pFVar1->super_AlignSpec).super_WidthSpec.width_;
  if (n < 2) {
    __s = BasicWriter<char>::grow_buffer(this_00,1);
  }
  else {
    __s = BasicWriter<char>::grow_buffer(this_00,n);
    uVar2 = (pFVar1->super_AlignSpec).super_WidthSpec.width_ - 1;
    if ((pFVar1->super_AlignSpec).align_ == ALIGN_LEFT) {
      if (uVar2 != 0) {
        memset(__s + 1,0x20,(ulong)uVar2);
      }
    }
    else {
      if (uVar2 == 0) {
        uVar2 = 0;
      }
      else {
        memset(__s,0x20,(ulong)uVar2);
        uVar2 = (pFVar1->super_AlignSpec).super_WidthSpec.width_ - 1;
      }
      __s = __s + uVar2;
    }
  }
  *__s = (char)value;
  return;
}

Assistant:

void visit_char(int value) {
    const FormatSpec &fmt_spec = this->spec();
    BasicWriter<Char> &w = this->writer();
    if (fmt_spec.type_ && fmt_spec.type_ != 'c')
      w.write_int(value, fmt_spec);
    typedef typename BasicWriter<Char>::CharPtr CharPtr;
    CharPtr out = CharPtr();
    if (fmt_spec.width_ > 1) {
      Char fill = ' ';
      out = w.grow_buffer(fmt_spec.width_);
      if (fmt_spec.align_ != ALIGN_LEFT) {
        std::fill_n(out, fmt_spec.width_ - 1, fill);
        out += fmt_spec.width_ - 1;
      } else {
        std::fill_n(out + 1, fmt_spec.width_ - 1, fill);
      }
    } else {
      out = w.grow_buffer(1);
    }
    *out = static_cast<Char>(value);
  }